

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O0

void ASDCP::WriterInfoDump(WriterInfo *Info,FILE *stream)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *local_160;
  UUID local_d8;
  UUID local_b8;
  UUID local_98;
  UUID local_68;
  char local_48 [8];
  char str_buf [40];
  FILE *local_18;
  FILE *stream_local;
  WriterInfo *Info_local;
  
  local_18 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    local_18 = _stderr;
  }
  Kumu::UUID::UUID(&local_68,Info->ProductUUID);
  pcVar1 = Kumu::UUID::EncodeHex(&local_68,local_48,0x28);
  fprintf(local_18,"       ProductUUID: %s\n",pcVar1);
  Kumu::UUID::~UUID(&local_68);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  pcVar1 = "No";
  if ((Info->EncryptedEssence & 1U) != 0) {
    pcVar1 = "Yes";
  }
  fprintf(local_18,
          "    ProductVersion: %s\n       CompanyName: %s\n       ProductName: %s\n  EncryptedEssence: %s\n"
          ,uVar2,uVar3,uVar4,pcVar1);
  if ((Info->EncryptedEssence & 1U) != 0) {
    pcVar1 = "No";
    if ((Info->UsesHMAC & 1U) != 0) {
      pcVar1 = "Yes";
    }
    fprintf(local_18,"              HMAC: %s\n",pcVar1);
    Kumu::UUID::UUID(&local_98,Info->ContextID);
    pcVar1 = Kumu::UUID::EncodeHex(&local_98,local_48,0x28);
    fprintf(local_18,"         ContextID: %s\n",pcVar1);
    Kumu::UUID::~UUID(&local_98);
    Kumu::UUID::UUID(&local_b8,Info->CryptographicKeyID);
    pcVar1 = Kumu::UUID::EncodeHex(&local_b8,local_48,0x28);
    fprintf(local_18,"CryptographicKeyID: %s\n",pcVar1);
    Kumu::UUID::~UUID(&local_b8);
  }
  Kumu::UUID::UUID(&local_d8,Info->AssetUUID);
  pcVar1 = Kumu::UUID::EncodeHex(&local_d8,local_48,0x28);
  fprintf(local_18,"         AssetUUID: %s\n",pcVar1);
  Kumu::UUID::~UUID(&local_d8);
  if (Info->LabelSetType == LS_MXF_SMPTE) {
    local_160 = "SMPTE";
  }
  else {
    local_160 = "Unknown";
    if (Info->LabelSetType == LS_MXF_INTEROP) {
      local_160 = "MXF Interop";
    }
  }
  fprintf(local_18,"    Label Set Type: %s\n",local_160);
  return;
}

Assistant:

void
ASDCP::WriterInfoDump(const WriterInfo& Info, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  char str_buf[40];

  fprintf(stream,"       ProductUUID: %s\n", UUID(Info.ProductUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"\
    ProductVersion: %s\n\
       CompanyName: %s\n\
       ProductName: %s\n\
  EncryptedEssence: %s\n",
	  Info.ProductVersion.c_str(),
	  Info.CompanyName.c_str(),
	  Info.ProductName.c_str(),
	  ( Info.EncryptedEssence ? "Yes" : "No" )
	  );

  if ( Info.EncryptedEssence )
    {
      fprintf(stream, "              HMAC: %s\n", ( Info.UsesHMAC ? "Yes" : "No"));
      fprintf(stream, "         ContextID: %s\n", UUID(Info.ContextID).EncodeHex(str_buf, 40));
      fprintf(stream, "CryptographicKeyID: %s\n", UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40));
    }

  fprintf(stream,"         AssetUUID: %s\n", UUID(Info.AssetUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"    Label Set Type: %s\n", ( Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
					       ( Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
						 "Unknown" ) ));
}